

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::operator-(real x,Expression *y)

{
  undefined8 extraout_RDX;
  float *in_RSI;
  ComputationGraph *in_RDI;
  undefined4 in_XMM0_Da;
  Expression EVar1;
  ComputationGraph *pg;
  ComputationGraph *this;
  VariableIndex local_34;
  VariableIndex *local_30;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff0;
  ComputationGraph *this_00;
  
  pg = *(ComputationGraph **)in_RSI;
  this = in_RDI;
  this_00 = in_RDI;
  VariableIndex::VariableIndex(&local_34,(VariableIndex *)(in_RSI + 2));
  local_30 = &local_34;
  local_28 = 1;
  ComputationGraph::add_function<cnn::ConstantMinusX,float&>
            (this_00,(initializer_list<cnn::VariableIndex> *)
                     CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),in_RSI);
  Expression::Expression((Expression *)this,pg,(VariableIndex *)in_RDI);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = this;
  return EVar1;
}

Assistant:

Expression operator-(real x, const Expression& y) { return Expression(y.pg, y.pg->add_function<ConstantMinusX>({y.i}, x)); }